

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConsumerToken::ConsumerToken<_zframe_t*,MyTraits>
          (ConsumerToken *this,ConcurrentQueue<_zframe_t_*,_MyTraits> *queue)

{
  __int_type_conflict1 _Var1;
  atomic<unsigned_int> *paVar2;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *queue_local;
  ConsumerToken *this_local;
  
  this->itemsConsumedFromCurrent = 0;
  this->currentProducer = (ConcurrentQueueProducerTypelessBase *)0x0;
  this->desiredProducer = (ConcurrentQueueProducerTypelessBase *)0x0;
  paVar2 = &queue->nextExplicitConsumerId;
  LOCK();
  _Var1 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  this->initialOffset = _Var1;
  this->lastKnownGlobalOffset = 0xffffffff;
  return;
}

Assistant:

ConsumerToken::ConsumerToken(ConcurrentQueue<T, Traits>& queue)
	: itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
	initialOffset = queue.nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
	lastKnownGlobalOffset = -1;
}